

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v9::detail::write_int_localized<fmt::v9::appender,unsigned__int128,char>
                   (appender out,unsigned___int128 value,uint prefix,basic_format_specs<char> *specs
                   ,digit_grouping<char> *grouping)

{
  undefined1 n [16];
  undefined1 value_00 [16];
  int iVar1;
  appender aVar2;
  basic_format_specs<char> *in_RDX;
  size_t in_RSI;
  uint size;
  char digits [40];
  int num_digits;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined8 in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff38;
  int num_digits_00;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff4c;
  undefined8 in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff68;
  anon_class_32_4_dca7119b *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  size_t size_00;
  undefined4 in_stack_ffffffffffffffa8;
  
  num_digits_00 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  n._4_4_ = in_stack_ffffffffffffff14;
  n._0_4_ = in_stack_ffffffffffffff10;
  n._8_8_ = in_stack_ffffffffffffff18;
  size_00 = in_RSI;
  iVar1 = count_digits((uint128_opt)n);
  value_00._8_8_ = in_RSI;
  value_00._0_8_ = in_stack_ffffffffffffff50;
  format_decimal<char,unsigned__int128>
            (in_stack_ffffffffffffff68,(unsigned___int128)value_00,in_stack_ffffffffffffff4c);
  digit_grouping<char>::count_separators
            ((digit_grouping<char> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             num_digits_00);
  to_unsigned<int>(0);
  aVar2.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container._4_4_ = iVar1;
  aVar2.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container._0_4_ =
       in_stack_ffffffffffffffa8;
  aVar2 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int_localized<fmt::v9::appender,unsigned__int128,char>(fmt::v9::appender,unsigned__int128,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::digit_grouping<char>const&)::_lambda(fmt::v9::appender)_1_>
                    (aVar2,in_RDX,size_00,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  return (appender)
         aVar2.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
}

Assistant:

auto write_int_localized(OutputIt out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs,
                         const digit_grouping<Char>& grouping) -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = count_digits(value);
  char digits[40];
  format_decimal(digits, value, num_digits);
  unsigned size = to_unsigned((prefix != 0 ? 1 : 0) + num_digits +
                              grouping.count_separators(num_digits));
  return write_padded<align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        if (prefix != 0) {
          char sign = static_cast<char>(prefix);
          *it++ = static_cast<Char>(sign);
        }
        return grouping.apply(it, string_view(digits, to_unsigned(num_digits)));
      });
}